

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O2

int archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  byte bVar1;
  uint ocode;
  int iVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  
  iVar5 = 0;
  if (length != 0) {
    plVar3 = (long *)f->data;
    if (*plVar3 == 0) {
      bVar1 = *buff;
      buff = (void *)((long)buff + 1);
      *(uint *)((long)plVar3 + 0x65164) = (uint)bVar1;
      *plVar3 = 1;
      length = length - 1;
    }
LAB_0016580f:
    do {
      while( true ) {
        bVar10 = length == 0;
        length = length - 1;
        if (bVar10) {
          return 0;
        }
        bVar1 = *buff;
        buff = (void *)((long)buff + 1);
        *plVar3 = *plVar3 + 1;
        ocode = *(uint *)((long)plVar3 + 0x65164);
        iVar4 = (uint)bVar1 * 0x10000 + ocode;
        *(int *)(plVar3 + 0xca2d) = iVar4;
        uVar9 = ocode ^ (uint)bVar1 << 8;
        iVar5 = *(int *)((long)plVar3 + (long)(int)uVar9 * 4 + 0x24);
        if (iVar5 != iVar4) break;
        *(uint *)((long)plVar3 + 0x65164) =
             (uint)*(ushort *)((long)plVar3 + (long)(int)uVar9 * 2 + 0x43648);
      }
      if (-1 < iVar5) {
        iVar5 = uVar9 - 0x10d89;
        if ((uint)bVar1 << 8 == ocode) {
          iVar5 = -1;
        }
        do {
          uVar7 = uVar9 + iVar5;
          uVar9 = uVar9 + 0x10d89 + iVar5;
          if (-1 < (int)uVar7) {
            uVar9 = uVar7;
          }
          iVar2 = *(int *)((long)plVar3 + 0x24 + (long)(int)uVar9 * 4);
          if (iVar2 == iVar4) {
            *(uint *)((long)plVar3 + 0x65164) =
                 (uint)*(ushort *)((long)plVar3 + (long)(int)uVar9 * 2 + 0x43648);
            goto LAB_0016580f;
          }
        } while (-1 < iVar2);
      }
      iVar5 = output_code(f,ocode);
      if (iVar5 != 0) {
        return iVar5;
      }
      *(uint *)((long)plVar3 + 0x65164) = (uint)bVar1;
      iVar5 = *(int *)((long)plVar3 + 0x6515c);
      if (iVar5 < (int)plVar3[4]) {
        *(int *)((long)plVar3 + 0x6515c) = iVar5 + 1;
        *(short *)((long)plVar3 + (long)(int)uVar9 * 2 + 0x43648) = (short)iVar5;
        *(int *)((long)plVar3 + (long)(int)uVar9 * 4 + 0x24) = (int)plVar3[0xca2d];
        goto LAB_0016580f;
      }
      lVar6 = *plVar3;
      if (lVar6 < plVar3[2]) goto LAB_0016580f;
      plVar3[2] = lVar6 + 10000;
      lVar8 = plVar3[1];
      if (lVar6 < 0x800000) {
        if (lVar8 != 0) {
          lVar6 = lVar6 << 8;
          goto LAB_0016592f;
        }
LAB_00165939:
        iVar5 = 0x7fffffff;
      }
      else {
        iVar5 = (int)(lVar8 / 0x100);
        if (iVar5 == 0) goto LAB_00165939;
        lVar8 = (long)iVar5;
LAB_0016592f:
        iVar5 = (int)(lVar6 / lVar8);
      }
      if ((int)plVar3[0xca2c] < iVar5) {
        *(int *)(plVar3 + 0xca2c) = iVar5;
        goto LAB_0016580f;
      }
      *(undefined4 *)(plVar3 + 0xca2c) = 0;
      memset((void *)((long)plVar3 + 0x24),0xff,0x43624);
      *(undefined4 *)((long)plVar3 + 0x6515c) = 0x101;
      iVar5 = output_code(f,0x100);
    } while (iVar5 == 0);
  }
  return iVar5;
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) + state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}